

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O2

int AndersonAcc(KINMem kin_mem,N_Vector gval,N_Vector fv,N_Vector x,N_Vector xold,long iter,
               sunrealtype *R,sunrealtype *gamma)

{
  sunrealtype *psVar1;
  N_Vector *pp_Var2;
  N_Vector p_Var3;
  N_Vector p_Var4;
  N_Vector *pp_Var5;
  KINDampingFn p_Var6;
  long lVar7;
  int iVar8;
  long i_2;
  long lVar9;
  int error_code;
  long lVar10;
  sunrealtype *psVar11;
  ulong uVar12;
  ulong uVar13;
  char *msgfmt;
  long lVar14;
  double *pdVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  sunrealtype sVar20;
  double dVar21;
  ulong local_38;
  
  psVar1 = kin_mem->kin_cv;
  pp_Var2 = kin_mem->kin_Xv;
  N_VLinearSum(0x3ff0000000000000,gval,xold);
  if (0 < iter) {
    lVar9 = kin_mem->kin_current_depth;
    if (lVar9 == kin_mem->kin_m_aa) {
      p_Var3 = *kin_mem->kin_dg_aa;
      p_Var4 = *kin_mem->kin_df_aa;
      for (lVar10 = 1; pp_Var5 = kin_mem->kin_dg_aa, lVar10 < lVar9; lVar10 = lVar10 + 1) {
        pp_Var5[lVar10 + -1] = pp_Var5[lVar10];
        kin_mem->kin_df_aa[lVar10 + -1] = kin_mem->kin_df_aa[lVar10];
      }
      pp_Var5[lVar9 + -1] = p_Var3;
      kin_mem->kin_df_aa[lVar9 + -1] = p_Var4;
      AndersonAccQRDelete(kin_mem,kin_mem->kin_q_aa,R,(int)lVar9);
      lVar9 = kin_mem->kin_current_depth + -1;
      kin_mem->kin_current_depth = lVar9;
    }
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,gval,kin_mem->kin_gold_aa,
                 kin_mem->kin_dg_aa[lVar9]);
    N_VLinearSum(0x3ff0000000000000,fv,kin_mem->kin_fold_aa,
                 kin_mem->kin_df_aa[kin_mem->kin_current_depth]);
    kin_mem->kin_current_depth = kin_mem->kin_current_depth + 1;
  }
  N_VScale(0x3ff0000000000000,gval,kin_mem->kin_gold_aa);
  N_VScale(0x3ff0000000000000,fv,kin_mem->kin_fold_aa);
  lVar9 = kin_mem->kin_current_depth;
  if (lVar9 != 1) {
    if (lVar9 != 0) {
      (*kin_mem->kin_qr_func)
                (kin_mem->kin_q_aa,R,kin_mem->kin_df_aa[lVar9 + -1],(int)lVar9 + -1,
                 (int)kin_mem->kin_m_aa,kin_mem->kin_qr_data);
      goto LAB_0010c963;
    }
    p_Var6 = kin_mem->kin_damping_fn;
    if (kin_mem->kin_damping_aa == 0) {
      if (p_Var6 == (KINDampingFn)0x0) goto LAB_0010cdf9;
LAB_0010c8d4:
      iVar8 = (*p_Var6)(kin_mem->kin_nni,xold,gval,(sunrealtype *)0x0,0,kin_mem->kin_user_data,
                        &kin_mem->kin_beta_aa);
      if (iVar8 == 0) {
        sVar20 = kin_mem->kin_beta_aa;
        if ((sVar20 <= 0.0) || (1.0 < sVar20)) {
          msgfmt = "The damping parameter is outside of the range (0, 1].";
          error_code = -0x12;
          iVar8 = 0xc3d;
          goto LAB_0010c9d0;
        }
        goto LAB_0010cb72;
      }
      msgfmt = "The damping function failed.";
      error_code = -0x12;
      iVar8 = 0xc37;
      goto LAB_0010c9d0;
    }
    if (p_Var6 != (KINDampingFn)0x0) goto LAB_0010c8d4;
LAB_0010c83a:
    sVar20 = kin_mem->kin_beta_aa;
LAB_0010cb72:
    N_VLinearSum(1.0 - sVar20,xold,gval,x);
    return 0;
  }
  dVar21 = (double)N_VDotProd(*kin_mem->kin_df_aa,*kin_mem->kin_df_aa);
  dVar19 = 0.0;
  if (0.0 < dVar21) {
    dVar19 = (double)N_VDotProd(*kin_mem->kin_df_aa,*kin_mem->kin_df_aa);
    if (dVar19 < 0.0) {
      dVar19 = sqrt(dVar19);
    }
    else {
      dVar19 = SQRT(dVar19);
    }
  }
  *R = dVar19;
  N_VScale(1.0 / dVar19,*kin_mem->kin_df_aa,*kin_mem->kin_q_aa);
LAB_0010c963:
  uVar17 = kin_mem->kin_current_depth;
  if (kin_mem->kin_depth_fn != (KINDepthFn)0x0) {
    local_38 = uVar17;
    iVar8 = (*kin_mem->kin_depth_fn)
                      (kin_mem->kin_nni,xold,gval,fv,kin_mem->kin_df_aa,R,uVar17,
                       kin_mem->kin_user_data,(long *)&local_38,(int *)0x0);
    if (iVar8 != 0) {
      msgfmt = "The depth function failed.";
      error_code = -0x13;
      iVar8 = 0xc6b;
      goto LAB_0010c9d0;
    }
    uVar17 = kin_mem->kin_current_depth;
    uVar16 = local_38;
    if ((long)uVar17 <= (long)local_38) {
      uVar16 = uVar17;
    }
    local_38 = 0;
    if ((long)uVar16 < 1) {
      kin_mem->kin_current_depth = 0;
      p_Var6 = kin_mem->kin_damping_fn;
      if (kin_mem->kin_damping_aa == 0) {
        if (p_Var6 == (KINDampingFn)0x0) {
LAB_0010cdf9:
          N_VScale(0x3ff0000000000000,gval,x);
          return 0;
        }
      }
      else if (p_Var6 == (KINDampingFn)0x0) goto LAB_0010c83a;
      iVar8 = (*p_Var6)(kin_mem->kin_nni,xold,gval,(sunrealtype *)0x0,0,kin_mem->kin_user_data,
                        &kin_mem->kin_beta_aa);
      if (iVar8 == 0) {
        sVar20 = kin_mem->kin_beta_aa;
        if ((0.0 < sVar20) && (sVar20 <= 1.0)) goto LAB_0010cb72;
        msgfmt = "The damping parameter is outside of the range (0, 1].";
        error_code = -0x12;
        iVar8 = 0xc87;
      }
      else {
        msgfmt = "The damping function failed.";
        error_code = -0x12;
        iVar8 = 0xc81;
      }
      goto LAB_0010c9d0;
    }
    local_38 = uVar16;
    if ((long)uVar16 < (long)uVar17) {
      for (lVar9 = 0; lVar9 < (long)(uVar17 - local_38); lVar9 = lVar9 + 1) {
        p_Var3 = *kin_mem->kin_dg_aa;
        p_Var4 = *kin_mem->kin_df_aa;
        for (lVar10 = 1; pp_Var5 = kin_mem->kin_dg_aa, lVar10 < (long)uVar17; lVar10 = lVar10 + 1) {
          pp_Var5[lVar10 + -1] = pp_Var5[lVar10];
          kin_mem->kin_df_aa[lVar10 + -1] = kin_mem->kin_df_aa[lVar10];
        }
        pp_Var5[uVar17 - 1] = p_Var3;
        kin_mem->kin_df_aa[uVar17 - 1] = p_Var4;
        AndersonAccQRDelete(kin_mem,kin_mem->kin_q_aa,R,(int)uVar17);
        uVar17 = kin_mem->kin_current_depth - 1;
        kin_mem->kin_current_depth = uVar17;
      }
    }
  }
  iVar8 = N_VDotProdMulti(uVar17 & 0xffffffff,fv,kin_mem->kin_q_aa,gamma);
  if (iVar8 != 0) {
    return -0x10;
  }
  if (kin_mem->kin_damping_fn != (KINDampingFn)0x0) {
    iVar8 = (*kin_mem->kin_damping_fn)
                      (kin_mem->kin_nni,xold,gval,gamma,uVar17,kin_mem->kin_user_data,
                       &kin_mem->kin_beta_aa);
    if (iVar8 == 0) {
      dVar21 = kin_mem->kin_beta_aa;
      if ((0.0 < dVar21) && (dVar21 <= 1.0)) goto LAB_0010cc11;
      msgfmt = "The damping parameter is outside of the range (0, 1].";
      error_code = -0x12;
      iVar8 = 0xcce;
    }
    else {
      msgfmt = "The damping function failed.";
      error_code = -0x12;
      iVar8 = 0xcc8;
    }
LAB_0010c9d0:
    KINProcessError(kin_mem,error_code,iVar8,"AndersonAcc",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                    ,msgfmt);
    return error_code;
  }
LAB_0010cc11:
  *psVar1 = 1.0;
  *pp_Var2 = gval;
  lVar10 = uVar17 * 8;
  psVar11 = R + (uVar17 - 1);
  uVar16 = 1;
  uVar12 = 2;
  lVar9 = uVar17 - 1;
  uVar18 = uVar17;
  for (lVar14 = lVar9; -1 < lVar14; lVar14 = lVar14 + -1) {
    lVar7 = kin_mem->kin_m_aa;
    dVar21 = gamma[lVar14];
    pdVar15 = (double *)(lVar7 * lVar10 + (long)psVar11);
    for (uVar13 = uVar18; (long)uVar13 < (long)uVar17; uVar13 = uVar13 + 1) {
      dVar21 = dVar21 - *pdVar15 * gamma[uVar13];
      gamma[lVar14] = dVar21;
      pdVar15 = pdVar15 + lVar7;
    }
    dVar19 = R[(lVar7 + 1) * lVar14];
    gamma[lVar14] = dVar21 / dVar19;
    psVar1[uVar16] = -(dVar21 / dVar19);
    pp_Var2[uVar16] = kin_mem->kin_dg_aa[lVar14];
    uVar16 = uVar16 + 1;
    uVar12 = uVar12 + 1;
    uVar18 = uVar18 - 1;
    psVar11 = psVar11 + -1;
    lVar10 = lVar10 + -8;
  }
  if ((kin_mem->kin_damping_aa != 0) || (kin_mem->kin_damping_fn != (KINDampingFn)0x0)) {
    dVar21 = 1.0 - kin_mem->kin_beta_aa;
    psVar1[uVar16 & 0xffffffff] = -dVar21;
    pp_Var2[uVar16 & 0xffffffff] = fv;
    for (; uVar16 = uVar12, -1 < lVar9; lVar9 = lVar9 + -1) {
      psVar1[uVar12] = gamma[lVar9] * dVar21;
      pp_Var2[uVar12] = kin_mem->kin_df_aa[lVar9];
      uVar12 = uVar12 + 1;
    }
  }
  iVar8 = N_VLinearCombination(uVar16 & 0xffffffff,psVar1,pp_Var2,x);
  return (uint)(iVar8 == 0) * 0x10 + -0x10;
}

Assistant:

static int AndersonAcc(KINMem kin_mem, N_Vector gval, N_Vector fv, N_Vector x,
                       N_Vector xold, long int iter, sunrealtype* R,
                       sunrealtype* gamma)
{
  int retval;
  long int lAA;
  sunrealtype alfa;
  sunrealtype onembeta;

  /* local shortcuts for fused vector operation */
  int nvec        = 0;
  sunrealtype* cv = kin_mem->kin_cv;
  N_Vector* Xv    = kin_mem->kin_Xv;

  /* Compute residual F(x) = G(x_old) - x_old */
  N_VLinearSum(ONE, gval, -ONE, xold, fv);

  if (iter > 0)
  {
    /* If we've filled the acceleration subspace, start recycling */
    if (kin_mem->kin_current_depth == kin_mem->kin_m_aa)
    {
      /* Move the left-most column vector (oldest value) to the end so it gets
         overwritten with the newest value below. */
      N_Vector tmp_dg = kin_mem->kin_dg_aa[0];
      N_Vector tmp_df = kin_mem->kin_df_aa[0];
      for (long int i = 1; i < kin_mem->kin_m_aa; i++)
      {
        kin_mem->kin_dg_aa[i - 1] = kin_mem->kin_dg_aa[i];
        kin_mem->kin_df_aa[i - 1] = kin_mem->kin_df_aa[i];
      }
      kin_mem->kin_dg_aa[kin_mem->kin_m_aa - 1] = tmp_dg;
      kin_mem->kin_df_aa[kin_mem->kin_m_aa - 1] = tmp_df;

      /* Delete left-most column vector from QR factorization */
      retval = AndersonAccQRDelete(kin_mem, kin_mem->kin_q_aa, R,
                                   (int)kin_mem->kin_m_aa);
      if (retval) { return retval; }

      kin_mem->kin_current_depth--;
    }

    /* compute dg_new = gval - gval_old */
    N_VLinearSum(ONE, gval, -ONE, kin_mem->kin_gold_aa,
                 kin_mem->kin_dg_aa[kin_mem->kin_current_depth]);

    /* compute df_new = fval - fval_old */
    N_VLinearSum(ONE, fv, -ONE, kin_mem->kin_fold_aa,
                 kin_mem->kin_df_aa[kin_mem->kin_current_depth]);

    kin_mem->kin_current_depth++;
  }

  N_VScale(ONE, gval, kin_mem->kin_gold_aa);
  N_VScale(ONE, fv, kin_mem->kin_fold_aa);

  /* on first iteration, do fixed point update */
  if (kin_mem->kin_current_depth == 0)
  {
    if (kin_mem->kin_damping_aa || kin_mem->kin_damping_fn)
    {
      if (kin_mem->kin_damping_fn)
      {
        retval = kin_mem->kin_damping_fn(kin_mem->kin_nni, xold, gval, NULL, 0,
                                         kin_mem->kin_user_data,
                                         &(kin_mem->kin_beta_aa));
        if (retval)
        {
          KINProcessError(kin_mem, KIN_DAMPING_FN_ERR, __LINE__, __func__,
                          __FILE__, "The damping function failed.");
          return KIN_DAMPING_FN_ERR;
        }
        if (kin_mem->kin_beta_aa <= ZERO || kin_mem->kin_beta_aa > ONE)
        {
          KINProcessError(kin_mem, KIN_DAMPING_FN_ERR, __LINE__, __func__,
                          __FILE__, "The damping parameter is outside of the range (0, 1].");
          return KIN_DAMPING_FN_ERR;
        }
      }

      /* damped fixed point */
      N_VLinearSum((ONE - kin_mem->kin_beta_aa), xold, kin_mem->kin_beta_aa,
                   gval, x);
    }
    else
    {
      /* standard fixed point */
      N_VScale(ONE, gval, x);
    }

    return KIN_SUCCESS;
  }

  /* Add a column to the QR factorization */

  if (kin_mem->kin_current_depth == 1)
  {
    R[0] = SUNRsqrt(N_VDotProd(kin_mem->kin_df_aa[0], kin_mem->kin_df_aa[0]));
    alfa = ONE / R[0];
    N_VScale(alfa, kin_mem->kin_df_aa[0], kin_mem->kin_q_aa[0]);
  }
  else
  {
    kin_mem->kin_qr_func(kin_mem->kin_q_aa, R,
                         kin_mem->kin_df_aa[kin_mem->kin_current_depth - 1],
                         (int)kin_mem->kin_current_depth - 1,
                         (int)kin_mem->kin_m_aa, (void*)kin_mem->kin_qr_data);
  }

  /* Adjust the depth */
  if (kin_mem->kin_depth_fn)
  {
    long int new_depth = kin_mem->kin_current_depth;

    retval = kin_mem->kin_depth_fn(kin_mem->kin_nni, xold, gval, fv,
                                   kin_mem->kin_df_aa, R,
                                   kin_mem->kin_current_depth,
                                   kin_mem->kin_user_data, &new_depth, NULL);
    if (retval)
    {
      KINProcessError(kin_mem, KIN_DEPTH_FN_ERR, __LINE__, __func__, __FILE__,
                      "The depth function failed.");
      return KIN_DEPTH_FN_ERR;
    }

    new_depth = SUNMIN(new_depth, kin_mem->kin_current_depth);
    new_depth = SUNMAX(new_depth, 0);

    if (new_depth == 0)
    {
      kin_mem->kin_current_depth = new_depth;

      /* do fixed point update */
      if (kin_mem->kin_damping_aa || kin_mem->kin_damping_fn)
      {
        if (kin_mem->kin_damping_fn)
        {
          retval = kin_mem->kin_damping_fn(kin_mem->kin_nni, xold, gval, NULL,
                                           0, kin_mem->kin_user_data,
                                           &(kin_mem->kin_beta_aa));
          if (retval)
          {
            KINProcessError(kin_mem, KIN_DAMPING_FN_ERR, __LINE__, __func__,
                            __FILE__, "The damping function failed.");
            return KIN_DAMPING_FN_ERR;
          }
          if (kin_mem->kin_beta_aa <= ZERO || kin_mem->kin_beta_aa > ONE)
          {
            KINProcessError(kin_mem, KIN_DAMPING_FN_ERR, __LINE__, __func__,
                            __FILE__, "The damping parameter is outside of the range (0, 1].");
            return KIN_DAMPING_FN_ERR;
          }
        }

        /* damped fixed point */
        N_VLinearSum((ONE - kin_mem->kin_beta_aa), xold, kin_mem->kin_beta_aa,
                     gval, x);
      }
      else
      {
        /* standard fixed point */
        N_VScale(ONE, gval, x);
      }

      return KIN_SUCCESS;
    }

    /* TODO(DJG): In the future, update QRDelete to support removing arbitrary
       columns from the factorization */
    if (new_depth < kin_mem->kin_current_depth)
    {
      /* Remove columns from the left one at a time */
      N_Vector tmp_dg = NULL;
      N_Vector tmp_df = NULL;

      for (int j = 0; j < kin_mem->kin_current_depth - new_depth; j++)
      {
        tmp_dg = kin_mem->kin_dg_aa[0];
        tmp_df = kin_mem->kin_df_aa[0];
        for (long int i = 1; i < kin_mem->kin_current_depth; i++)
        {
          kin_mem->kin_dg_aa[i - 1] = kin_mem->kin_dg_aa[i];
          kin_mem->kin_df_aa[i - 1] = kin_mem->kin_df_aa[i];
        }
        kin_mem->kin_dg_aa[kin_mem->kin_current_depth - 1] = tmp_dg;
        kin_mem->kin_df_aa[kin_mem->kin_current_depth - 1] = tmp_df;

        retval = AndersonAccQRDelete(kin_mem, kin_mem->kin_q_aa, R,
                                     (int)kin_mem->kin_current_depth);
        if (retval) { return retval; }

        kin_mem->kin_current_depth--;
      }
    }
  }

  /* Solve least squares problem and update solution */
  lAA = kin_mem->kin_current_depth;

  /* Compute Q^T fv */
  retval = N_VDotProdMulti((int)lAA, fv, kin_mem->kin_q_aa, gamma);
  if (retval != KIN_SUCCESS) { return (KIN_VECTOROP_ERR); }

  /* Compute the damping factor before overwriting gamma below so we can pass
     gamma = Q^T fv (just computed above) to the damping function as it can be
     used to compute the acceleration gain = sqrt(1 - ||Q^T fv||^2/||fv||^2). */
  if (kin_mem->kin_damping_fn)
  {
    retval = kin_mem->kin_damping_fn(kin_mem->kin_nni, xold, gval, gamma, lAA,
                                     kin_mem->kin_user_data,
                                     &(kin_mem->kin_beta_aa));
    if (retval)
    {
      KINProcessError(kin_mem, KIN_DAMPING_FN_ERR, __LINE__, __func__, __FILE__,
                      "The damping function failed.");
      return KIN_DAMPING_FN_ERR;
    }
    if (kin_mem->kin_beta_aa <= ZERO || kin_mem->kin_beta_aa > ONE)
    {
      KINProcessError(kin_mem, KIN_DAMPING_FN_ERR, __LINE__, __func__, __FILE__,
                      "The damping parameter is outside of the range (0, 1].");
      return KIN_DAMPING_FN_ERR;
    }
  }

  /* set arrays for fused vector operation */
  cv[0] = ONE;
  Xv[0] = gval;
  nvec  = 1;

  /* Solve the upper triangular system R gamma = Q^T fv */
  for (long int i = lAA - 1; i > -1; i--)
  {
    for (long int j = i + 1; j < lAA; j++)
    {
      gamma[i] = gamma[i] - R[j * kin_mem->kin_m_aa + i] * gamma[j];
    }
    gamma[i] = gamma[i] / R[i * kin_mem->kin_m_aa + i];

    cv[nvec] = -gamma[i];
    Xv[nvec] = kin_mem->kin_dg_aa[i];
    nvec += 1;
  }

  /* if enabled, apply damping */
  if (kin_mem->kin_damping_aa || kin_mem->kin_damping_fn)
  {
    onembeta = (ONE - kin_mem->kin_beta_aa);
    cv[nvec] = -onembeta;
    Xv[nvec] = fv;
    nvec += 1;
    for (long int i = lAA - 1; i > -1; i--)
    {
      cv[nvec] = onembeta * gamma[i];
      Xv[nvec] = kin_mem->kin_df_aa[i];
      nvec += 1;
    }
  }

  /* update solution */
  retval = N_VLinearCombination(nvec, cv, Xv, x);
  if (retval != KIN_SUCCESS) { return (KIN_VECTOROP_ERR); }

  return KIN_SUCCESS;
}